

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

void xm_envelope_tick(xm_channel_context_t *ch,xm_envelope_t *env,uint16_t *counter,float *outval)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  float fVar6;
  
  bVar1 = env->num_points;
  if (bVar1 < 2) {
    if (bVar1 != 1) {
      return;
    }
    fVar6 = (float)env->points[0].value * 0.015625;
    *outval = fVar6;
    if (fVar6 <= 1.0) {
      return;
    }
    *outval = 1.0;
    return;
  }
  uVar4 = *counter;
  if ((env->loop_enabled == true) &&
     (uVar2 = env->points[env->loop_end_point].frame, uVar2 <= uVar4)) {
    uVar4 = (uVar4 - uVar2) + env->points[env->loop_start_point].frame;
    *counter = uVar4;
  }
  if (bVar1 == 2) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if ((env->points[uVar5].frame <= uVar4) && (uVar4 <= env->points[(int)uVar5 + 1].frame))
      break;
      uVar5 = uVar5 + 1;
    } while (((uint)uVar5 & 0xff) < bVar1 - 2);
    uVar5 = uVar5 & 0xff;
  }
  uVar2 = env->points[uVar5].frame;
  if (uVar2 < uVar4) {
    uVar3 = env->points[uVar5 + 1].frame;
    if (uVar4 < uVar3) {
      fVar6 = (float)(int)((uint)uVar4 - (uint)uVar2) / (float)(int)((uint)uVar3 - (uint)uVar2);
      fVar6 = (float)env->points[uVar5 + 1].value * fVar6 +
              (1.0 - fVar6) * (float)env->points[uVar5].value;
      goto LAB_001061bd;
    }
    uVar2 = env->points[uVar5 + 1].value;
  }
  else {
    uVar2 = env->points[uVar5].value;
  }
  fVar6 = (float)uVar2;
LAB_001061bd:
  *outval = fVar6 * 0.015625;
  if (((ch->sustained != true) || (env->sustain_enabled != true)) ||
     (uVar4 != env->points[env->sustain_point].frame)) {
    *counter = uVar4 + 1;
  }
  return;
}

Assistant:

static void xm_envelope_tick(xm_channel_context_t* ch,
							 xm_envelope_t* env,
							 uint16_t* counter,
							 float* outval) {
	if(env->num_points < 2) {
		/* Don't really know what to do… */
		if(env->num_points == 1) {
			/* XXX I am pulling this out of my ass */
			*outval = (float)env->points[0].value / (float)0x40;
			if(*outval > 1) {
				*outval = 1;
			}
		}

		return;
	} else {
		uint8_t j;

		if(env->loop_enabled) {
			uint16_t loop_start = env->points[env->loop_start_point].frame;
			uint16_t loop_end = env->points[env->loop_end_point].frame;
			uint16_t loop_length = loop_end - loop_start;

			if(*counter >= loop_end) {
				*counter -= loop_length;
			}
		}

		for(j = 0; j < (env->num_points - 2); ++j) {
			if(env->points[j].frame <= *counter &&
			   env->points[j+1].frame >= *counter) {
				break;
			}
		}

		*outval = xm_envelope_lerp(env->points + j, env->points + j + 1, *counter) / (float)0x40;

		/* Make sure it is safe to increment frame count */
		if(!ch->sustained || !env->sustain_enabled ||
		   *counter != env->points[env->sustain_point].frame) {
			(*counter)++;
		}
	}
}